

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_stalker::se_stalker(se_stalker *this)

{
  se_stalker *this_local;
  
  cse_alife_human_stalker::cse_alife_human_stalker(&this->super_cse_alife_human_stalker);
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
  super_cse_alife_trader_abstract._vptr_cse_alife_trader_abstract =
       (_func_int **)&PTR_state_merge_00390690;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract = &PTR__se_stalker_003906e0;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x118 =
       &PTR__se_stalker_00390748;
  (this->super_cse_alife_human_stalker).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_stalker_00390770;
  this->m_job_online = '\0';
  this->m_was_in_smart_terrain = false;
  this->m_death_dropped = false;
  std::__cxx11::string::string((string *)&this->m_squad_id);
  this->m_sim_forced_online = false;
  std::__cxx11::string::string((string *)&this->m_old_lvid);
  std::__cxx11::string::string((string *)&this->m_active_section);
  return;
}

Assistant:

se_stalker::se_stalker(): m_job_online(0), m_was_in_smart_terrain(false), m_death_dropped(false),
	m_sim_forced_online(false) {}